

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O2

Vec3fa __thiscall
embree::OBJMaterial__eval
          (embree *this,ISPCOBJMaterial *material,BRDF *brdf,Vec3fa *wo,DifferentialGeometry *dg,
          Vec3fa *wi)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Vec3fa VVar11;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  fVar7 = 0.0;
  fVar8 = 0.0;
  fVar9 = 0.0;
  fVar10 = 0.0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  fVar1 = (brdf->Kd).field_0.m128[1];
  fVar4 = (brdf->Kd).field_0.m128[2];
  fVar6 = (brdf->Kd).field_0.m128[0];
  if (fVar1 <= fVar6) {
    fVar1 = fVar6;
  }
  if (fVar4 <= fVar1) {
    fVar4 = fVar1;
  }
  fVar6 = (brdf->Ks).field_0.m128[1];
  fVar1 = (brdf->Ks).field_0.m128[0];
  if (fVar6 <= fVar1) {
    fVar6 = fVar1;
  }
  fVar1 = (brdf->Ks).field_0.m128[2];
  fVar2 = 0.0;
  if (fVar1 <= fVar6) {
    fVar1 = fVar6;
  }
  uVar3 = 0;
  if (0.0 < fVar4) {
    fVar4 = (wi->field_0).m128[2] * (dg->Ns).field_0.m128[2] +
            (wi->field_0).m128[1] * (dg->Ns).field_0.m128[1] +
            (wi->field_0).m128[0] * (dg->Ns).field_0.m128[0];
    if (1.0 <= fVar4) {
      fVar4 = 1.0;
    }
    fVar6 = 0.0;
    if (0.0 <= fVar4) {
      fVar6 = fVar4;
    }
    fVar6 = fVar6 * 0.31830987;
    fVar7 = fVar6 * (brdf->Kd).field_0.m128[0] + 0.0;
    fVar8 = fVar6 * (brdf->Kd).field_0.m128[1] + 0.0;
    fVar9 = fVar6 * (brdf->Kd).field_0.m128[2] + 0.0;
    fVar10 = fVar6 * (brdf->Kd).field_0.m128[3] + 0.0;
    *(float *)this = fVar7;
    *(float *)(this + 4) = fVar8;
    *(float *)(this + 8) = fVar9;
    *(float *)(this + 0xc) = fVar10;
  }
  if (0.0 < fVar1) {
    reflect(wo,&dg->Ns);
    fVar2 = fStack_2c * (wi->field_0).m128[3];
    fVar1 = fStack_30 * (wi->field_0).m128[2] +
            fStack_34 * (wi->field_0).m128[1] + local_38 * (wi->field_0).m128[0];
    uVar3 = 0;
    if (0.0 < fVar1) {
      fVar4 = brdf->Ns;
      if (fVar1 <= 1e-10) {
        fVar1 = 1e-10;
      }
      fVar1 = powf(fVar1,fVar4);
      fVar6 = (wi->field_0).m128[2] * (dg->Ns).field_0.m128[2] +
              (wi->field_0).m128[1] * (dg->Ns).field_0.m128[1] +
              (wi->field_0).m128[0] * (dg->Ns).field_0.m128[0];
      if (1.0 <= fVar6) {
        fVar6 = 1.0;
      }
      uVar3 = CONCAT44((wi->field_0).m128[3] * (dg->Ns).field_0.m128[3],fVar6);
      fVar5 = 0.0;
      if (0.0 <= fVar6) {
        fVar5 = fVar6;
      }
      fVar5 = fVar5 * fVar1 * (fVar4 + 2.0) * 0.15915494;
      fVar4 = (brdf->Ks).field_0.m128[2];
      fVar6 = (brdf->Ks).field_0.m128[3];
      fVar1 = fVar7 + fVar5 * (brdf->Ks).field_0.m128[0];
      fVar2 = fVar8 + fVar5 * (brdf->Ks).field_0.m128[1];
      *(float *)this = fVar1;
      *(float *)(this + 4) = fVar2;
      *(float *)(this + 8) = fVar9 + fVar5 * fVar4;
      *(float *)(this + 0xc) = fVar10 + fVar5 * fVar6;
    }
  }
  VVar11.field_0.m128[1] = fVar2;
  VVar11.field_0.m128[0] = fVar1;
  VVar11.field_0._8_8_ = uVar3;
  return (Vec3fa)VVar11.field_0;
}

Assistant:

Vec3fa OBJMaterial__eval(ISPCOBJMaterial* material, const BRDF& brdf, const Vec3fa& wo, const DifferentialGeometry& dg, const Vec3fa& wi)
{
  Vec3fa R = Vec3fa(0.0f);
  const float Md = max(max(brdf.Kd.x,brdf.Kd.y),brdf.Kd.z);
  const float Ms = max(max(brdf.Ks.x,brdf.Ks.y),brdf.Ks.z);
  const float Mt = max(max(brdf.Kt.x,brdf.Kt.y),brdf.Kt.z);
  if (Md > 0.0f) {
    R = R + (1.0f/float(M_PI)) * clamp(dot(wi,dg.Ns)) * brdf.Kd;
  }
  if (Ms > 0.0f) {
    const Sample3f refl = make_Sample3f(reflect(wo,dg.Ns),1.0f);
    if (dot(refl.v,wi) > 0.0f)
      R = R + (brdf.Ns+2) * float(one_over_two_pi) * powf(max(1e-10f,dot(refl.v,wi)),brdf.Ns) * clamp(dot(wi,dg.Ns)) * brdf.Ks;
  }
  if (Mt > 0.0f) {
  }
  return R;
}